

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::ContactMaterial::ContactMaterial(ContactMaterial *this,RoboSimian *robot)

{
  element_type *peVar1;
  shared_ptr<chrono::ChContactContainer::AddContactCallback> local_60;
  shared_ptr<chrono::ChContactContainer> local_50 [2];
  undefined1 local_28 [8];
  shared_ptr<chrono::robosimian::ContactMaterial> shared_this;
  RoboSimian *robot_local;
  ContactMaterial *this_local;
  
  shared_this.super___shared_ptr<chrono::robosimian::ContactMaterial,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)robot;
  ChContactContainer::AddContactCallback::AddContactCallback(&this->super_AddContactCallback);
  (this->super_AddContactCallback)._vptr_AddContactCallback =
       (_func_int **)&PTR__ContactMaterial_002ed9a0;
  this->m_robot =
       (RoboSimian *)
       shared_this.
       super___shared_ptr<chrono::robosimian::ContactMaterial,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  std::shared_ptr<chrono::robosimian::ContactMaterial>::
  shared_ptr<chrono::robosimian::ContactMaterial,chrono::robosimian::ContactMaterial::shared_ptr(chrono::robosimian::RoboSimian*)::_lambda(chrono::robosimian::ContactMaterial*)_1_,void>
            ((shared_ptr<chrono::robosimian::ContactMaterial> *)local_28);
  RoboSimian::GetSystem(this->m_robot);
  ChSystem::GetContactContainer((ChSystem *)local_50);
  peVar1 = std::
           __shared_ptr_access<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  std::shared_ptr<chrono::ChContactContainer::AddContactCallback>::
  shared_ptr<chrono::robosimian::ContactMaterial,void>
            (&local_60,(shared_ptr<chrono::robosimian::ContactMaterial> *)local_28);
  (**(code **)(*(long *)peVar1 + 0x210))(peVar1,&local_60);
  std::shared_ptr<chrono::ChContactContainer::AddContactCallback>::~shared_ptr(&local_60);
  std::shared_ptr<chrono::ChContactContainer>::~shared_ptr(local_50);
  std::shared_ptr<chrono::robosimian::ContactMaterial>::~shared_ptr
            ((shared_ptr<chrono::robosimian::ContactMaterial> *)local_28);
  return;
}

Assistant:

ContactMaterial(RoboSimian* robot) : m_robot(robot) {
        std::shared_ptr<ContactMaterial> shared_this(this, [](ContactMaterial*) {});
        m_robot->GetSystem()->GetContactContainer()->RegisterAddContactCallback(shared_this);
    }